

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::VectorRasterizerTests::
__PositiveOffsetXInterCellsVerticalLinesProducePositiveCoverAndArea_meta(char **name)

{
  char **name_local;
  
  *name = "PositiveOffsetXInterCellsVerticalLinesProducePositiveCoverAndArea";
  return (offset_in_this_suite_class_to_subr)
         PositiveOffsetXInterCellsVerticalLinesProducePositiveCoverAndArea;
}

Assistant:

test( PositiveOffsetXInterCellsVerticalLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(15.17), fp(10.1), fp(15.17), fp(12.0));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, 20240, 230 },
					{ 15, 11, 22528, 256 },
					{ 15, 12, 0, 0 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(53.73), fp(9.0), fp(53.73), fp(13.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 53, 9, 95744, 256 },
					{ 53, 10, 95744, 256 },
					{ 53, 11, 95744, 256 },
					{ 53, 12, 95744, 256 },
					{ 53, 13, 0, 0 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-301.91), fp(-2.8), fp(-301.91), fp(-0.5));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -302, -3, 9430, 205 },
					{ -302, -2, 11776, 256 },
					{ -302, -1, 5888, 128 },
				};

				assert_equal(reference3, vr.cells());
			}